

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

golf_transform_t *
golf_entity_get_world_transform
          (golf_transform_t *__return_storage_ptr__,golf_level_t *level,golf_entity_t *entity)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  mat4 m;
  golf_transform_t *pgVar4;
  vec3 vVar5;
  vec3 v1;
  quat qVar6;
  quat q;
  float local_d4;
  float local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  mat4 local_58;
  
  vVar5 = vec3_create(0.0,0.0,0.0);
  local_d0 = vVar5.z;
  local_98 = vVar5._0_8_;
  vVar5 = vec3_create(1.0,1.0,1.0);
  local_d4 = vVar5.z;
  local_a8 = vVar5._0_8_;
  qVar6 = quat_create(0.0,0.0,0.0,1.0);
  local_b8 = qVar6._0_8_;
  local_c8 = qVar6._8_8_;
  if (-1 < (long)entity->parent_idx) {
    pgVar4 = golf_entity_get_transform((level->entities).data + entity->parent_idx);
    if (pgVar4 != (golf_transform_t *)0x0) {
      local_98._0_4_ = (pgVar4->position).x;
      local_98._4_4_ = (pgVar4->position).y;
      local_d0 = (pgVar4->position).z;
      local_b8._0_4_ = (pgVar4->rotation).x;
      local_b8._4_4_ = (pgVar4->rotation).y;
      local_c8._0_4_ = (pgVar4->rotation).z;
      local_c8._4_4_ = (pgVar4->rotation).w;
      local_a8._0_4_ = (pgVar4->scale).x;
      local_a8._4_4_ = (pgVar4->scale).y;
      local_d4 = (pgVar4->scale).z;
    }
  }
  pgVar4 = golf_entity_get_transform(entity);
  if (pgVar4 == (golf_transform_t *)0x0) {
    golf_log_warning("Attempting to get world transform on entity with no transform");
    local_68 = (float)local_b8;
    fStack_64 = local_b8._4_4_;
    local_78 = (float)local_c8;
    fStack_74 = local_c8._4_4_;
  }
  else {
    qVar6.z = (float)local_c8;
    qVar6.w = local_c8._4_4_;
    qVar6.x = (float)local_b8;
    qVar6.y = local_b8._4_4_;
    qVar6 = quat_multiply(qVar6,pgVar4->rotation);
    uVar2 = (pgVar4->scale).x;
    uVar3 = (pgVar4->scale).y;
    fVar1 = (pgVar4->scale).z;
    q.z = (float)local_c8;
    q.w = local_c8._4_4_;
    q.x = (float)local_b8;
    q.y = local_b8._4_4_;
    mat4_from_quat(&local_58,q);
    m.m[2] = local_58.m[2];
    m.m[3] = local_58.m[3];
    m.m[0] = local_58.m[0];
    m.m[1] = local_58.m[1];
    m.m[4] = local_58.m[4];
    m.m[5] = local_58.m[5];
    m.m[6] = local_58.m[6];
    m.m[7] = local_58.m[7];
    m.m[8] = local_58.m[8];
    m.m[9] = local_58.m[9];
    m.m[10] = local_58.m[10];
    m.m[0xb] = local_58.m[0xb];
    m.m[0xc] = local_58.m[0xc];
    m.m[0xd] = local_58.m[0xd];
    m.m[0xe] = local_58.m[0xe];
    m.m[0xf] = local_58.m[0xf];
    vVar5 = vec3_apply_mat4(pgVar4->position,1.0,m);
    v1.x = vVar5.x * (float)local_a8;
    v1.y = vVar5.y * local_a8._4_4_;
    v1.z = vVar5.z * local_d4;
    vVar5.z = local_d0;
    vVar5.x = (float)local_98;
    vVar5.y = local_98._4_4_;
    vVar5 = vec3_add(v1,vVar5);
    local_d0 = vVar5.z;
    local_98._0_4_ = vVar5.x;
    local_98._4_4_ = vVar5.y;
    local_68 = qVar6.x;
    fStack_64 = qVar6.y;
    local_78 = qVar6.z;
    fStack_74 = qVar6.w;
    local_d4 = fVar1 * local_d4;
    local_a8._0_4_ = (float)uVar2 * (float)local_a8;
    local_a8._4_4_ = (float)uVar3 * local_a8._4_4_;
  }
  (__return_storage_ptr__->position).x = (float)local_98;
  (__return_storage_ptr__->position).y = local_98._4_4_;
  (__return_storage_ptr__->position).z = local_d0;
  (__return_storage_ptr__->rotation).x = local_68;
  (__return_storage_ptr__->rotation).y = fStack_64;
  (__return_storage_ptr__->rotation).z = local_78;
  (__return_storage_ptr__->rotation).w = fStack_74;
  (__return_storage_ptr__->scale).x = (float)local_a8;
  (__return_storage_ptr__->scale).y = local_a8._4_4_;
  (__return_storage_ptr__->scale).z = local_d4;
  return __return_storage_ptr__;
}

Assistant:

golf_transform_t golf_entity_get_world_transform(golf_level_t *level, golf_entity_t *entity) {
    golf_transform_t parent_transform = golf_transform(V3(0, 0, 0), V3(1, 1, 1), QUAT(0, 0, 0, 1));
    if (entity->parent_idx >= 0) {
        golf_entity_t *parent_entity = &level->entities.data[entity->parent_idx];
        golf_transform_t *transform = golf_entity_get_transform(parent_entity);
        if (transform) {
            parent_transform = *transform;
        }
    }

    golf_transform_t *transform = golf_entity_get_transform(entity);
    if (!transform) {
        golf_log_warning("Attempting to get world transform on entity with no transform");
        return parent_transform;
    }

    quat rotation = quat_multiply(parent_transform.rotation, transform->rotation);

    vec3 scale = parent_transform.scale;
    scale.x *= transform->scale.x;
    scale.y *= transform->scale.y;
    scale.z *= transform->scale.z;

    vec3 position = vec3_apply_mat4(transform->position, 1, mat4_from_quat(parent_transform.rotation));
    position.x *= parent_transform.scale.x;
    position.y *= parent_transform.scale.y;
    position.z *= parent_transform.scale.z;
    position = vec3_add(position, parent_transform.position);

    return golf_transform(position, scale, rotation);
}